

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

void __thiscall
pbrt::WindowedPiecewiseConstant2D::WindowedPiecewiseConstant2D
          (WindowedPiecewiseConstant2D *this,Array2D<float> *f,Allocator alloc)

{
  SummedAreaTable::SummedAreaTable(&this->sat,f,alloc);
  Array2D<float>::Array2D(&this->func,f,(allocator_type)alloc.memoryResource);
  return;
}

Assistant:

WindowedPiecewiseConstant2D(Array2D<Float> f, Allocator alloc = {})
        : sat(f, alloc), func(f, alloc) {}